

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::SingleVertexArrayNormalizeGroup::init
          (SingleVertexArrayNormalizeGroup *this,EVP_PKEY_CTX *ctx)

{
  int t;
  InputType type;
  GLValue max_;
  undefined8 *puVar1;
  long *plVar2;
  MultiVertexArrayTest *this_00;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
  *pvVar3;
  int **ppiVar4;
  int *piVar5;
  undefined8 uVar6;
  long lVar7;
  GLValue GVar8;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  int local_11c;
  undefined1 local_118 [16];
  pointer local_108;
  pointer pAStack_100;
  pointer local_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  string local_d0;
  undefined1 local_b0 [16];
  int *local_a0;
  long lStack_98;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_11c = 2;
  do {
    lVar7 = 0;
    do {
      if (this->m_type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
        if (local_11c == 4) {
LAB_0119ab94:
          typeToString<int>(&local_70,local_11c);
          puVar1 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1ae7fee);
          pvVar3 = (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)(puVar1 + 2);
          if ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)*puVar1 == pvVar3) {
            local_108 = *(pointer *)pvVar3;
            pAStack_100 = (pointer)puVar1[3];
            local_118._0_8_ =
                 (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                  *)&local_108;
          }
          else {
            local_108 = *(pointer *)pvVar3;
            local_118._0_8_ =
                 (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                  *)*puVar1;
          }
          local_118._8_8_ = puVar1[1];
          *puVar1 = pvVar3;
          puVar1[1] = 0;
          *(undefined1 *)(puVar1 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append(local_118);
          ppiVar4 = (int **)(plVar2 + 2);
          if ((int **)*plVar2 == ppiVar4) {
            local_a0 = *ppiVar4;
            lStack_98 = plVar2[3];
            local_b0._0_8_ = &local_a0;
          }
          else {
            local_a0 = *ppiVar4;
            local_b0._0_8_ = (int **)*plVar2;
          }
          local_b0._8_8_ = plVar2[1];
          *plVar2 = (long)ppiVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          t = *(int *)((long)&DAT_01c0f870 + lVar7);
          typeToString<int>(&local_d0,t);
          piVar5 = (int *)0xf;
          if ((int **)local_b0._0_8_ != &local_a0) {
            piVar5 = local_a0;
          }
          if (piVar5 < (int *)(local_d0._M_string_length + local_b0._8_8_)) {
            uVar6 = (int *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar6 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar6 < (int *)(local_d0._M_string_length + local_b0._8_8_))
            goto LAB_0119acd4;
            puVar1 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,local_b0._0_8_);
          }
          else {
LAB_0119acd4:
            puVar1 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_b0,(ulong)local_d0._M_dataplus._M_p);
          }
          plVar2 = puVar1 + 2;
          if ((long *)*puVar1 == plVar2) {
            local_e0 = *plVar2;
            uStack_d8 = puVar1[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0 = *plVar2;
            local_f0 = (long *)*puVar1;
          }
          local_e8 = puVar1[1];
          *puVar1 = plVar2;
          puVar1[1] = 0;
          *(undefined1 *)plVar2 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((int **)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,(long)local_a0 + 1);
          }
          if ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)local_118._0_8_ !=
              (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)&local_108) {
            operator_delete((void *)local_118._0_8_,(ulong)((long)&local_108->inputType + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          type = this->m_type;
          GVar8 = deqp::gls::GLValue::getMinValue(type);
          aStack_38 = GVar8.field_1;
          local_40 = GVar8.type;
          GVar8 = deqp::gls::GLValue::getMaxValue(this->m_type);
          aStack_48 = GVar8.field_1;
          local_50 = GVar8.type;
          max_._4_4_ = uStack_4c;
          max_.type = local_50;
          GVar8._4_4_ = uStack_3c;
          GVar8.type = local_40;
          GVar8.field_1 = aStack_38;
          max_.field_1 = aStack_48;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_b0,type,OUTPUTTYPE_VEC4,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                     local_11c,0,0,true,GVar8,max_);
          local_108 = (pointer)0x0;
          pAStack_100 = (pointer)0x0;
          local_f8 = (pointer)0x0;
          local_118._4_4_ = t;
          local_118._0_4_ = PRIMITIVE_TRIANGLES;
          local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_108,(iterator)0x0,(ArraySpec *)local_b0);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_118,(char *)local_f0,(char *)local_f0);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          if (local_108 != (pointer)0x0) {
            operator_delete(local_108,(long)local_f8 - (long)local_108);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
        }
      }
      else if (local_11c == 4 || this->m_type != INPUTTYPE_INT_2_10_10_10) goto LAB_0119ab94;
      lVar7 = lVar7 + 4;
    } while (lVar7 == 4);
    local_11c = local_11c + 1;
    if (local_11c == 5) {
      return 5;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayNormalizeGroup::init (void)
{
	int					counts[]		= {1, 256};

	for (int componentCount = 2; componentCount < 5; componentCount++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
				continue;

			std::string name = "components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

			MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
															Array::OUTPUTTYPE_VEC4,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															componentCount,
															0,
															0,
															true,
															GLValue::getMinValue(m_type),
															GLValue::getMaxValue(m_type));

			MultiVertexArrayTest::Spec spec;
			spec.primitive	= Array::PRIMITIVE_TRIANGLES;
			spec.drawCount	= counts[countNdx];
			spec.first		= 0;
			spec.arrays.push_back(arraySpec);

			addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
		}
	}
}